

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCoolingTowerType::IfcCoolingTowerType(IfcCoolingTowerType *this)

{
  IfcCoolingTowerType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1e0,"IfcCoolingTowerType");
  Schema_2x3::IfcEnergyConversionDeviceType::IfcEnergyConversionDeviceType
            (&this->super_IfcEnergyConversionDeviceType,&PTR_construction_vtable_24__00fb0cc0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCoolingTowerType,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCoolingTowerType,_1UL> *)
             &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
              field_0x1b0,&PTR_construction_vtable_24__00fb0ea0);
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0xfb0b40;
  *(undefined8 *)&this->field_0x1e0 = 0xfb0ca8;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0xfb0b68;
  (this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xfb0b90;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0xfb0bb8;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0xfb0be0;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0xfb0c08;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0xfb0c30;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0xfb0c58;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.field_0x1b0 =
       0xfb0c80;
  std::__cxx11::string::string((string *)&(this->super_IfcEnergyConversionDeviceType).field_0x1c0);
  return;
}

Assistant:

IfcCoolingTowerType() : Object("IfcCoolingTowerType") {}